

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O1

void __thiscall leveldb::EnvTest_RunImmediately_Test::TestBody(EnvTest_RunImmediately_Test *this)

{
  Env *pEVar1;
  int iVar2;
  RunState state;
  pthread_mutex_t local_88;
  condition_variable local_60 [48];
  pthread_mutex_t *local_30;
  char local_28;
  
  local_88._16_8_ = 0;
  local_88.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_88.__align = 0;
  local_88._8_8_ = 0;
  local_88.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(local_60);
  local_28 = '\0';
  pEVar1 = (this->super_EnvTest).env_;
  local_30 = &local_88;
  (*pEVar1->_vptr_Env[0x11])(pEVar1,TestBody::RunState::Run,&local_88);
  iVar2 = pthread_mutex_lock(&local_88);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (local_28 == '\0') {
    do {
      std::condition_variable::wait((unique_lock *)local_60);
    } while (local_28 != '\x01');
  }
  pthread_mutex_unlock(&local_88);
  std::condition_variable::~condition_variable(local_60);
  return;
}

Assistant:

TEST_F(EnvTest, RunImmediately) {
  struct RunState {
    port::Mutex mu;
    port::CondVar cvar{&mu};
    bool called = false;

    static void Run(void* arg) {
      RunState* state = reinterpret_cast<RunState*>(arg);
      MutexLock l(&state->mu);
      ASSERT_EQ(state->called, false);
      state->called = true;
      state->cvar.Signal();
    }
  };

  RunState state;
  env_->Schedule(&RunState::Run, &state);

  MutexLock l(&state.mu);
  while (!state.called) {
    state.cvar.Wait();
  }
}